

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O2

ActionResults * __thiscall GreenRoomFourAction::Go(GreenRoomFourAction *this)

{
  itemLocation iVar1;
  itemType iVar2;
  ItemWrapper *this_00;
  ActionResults *this_01;
  string *this_02;
  itemType local_dc;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_dc = KID;
  this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_dc);
  iVar1 = ItemWrapper::getLocation(this_00);
  if (iVar1 == HIDDEN) {
    this_01 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_38,
               "You find yourself in the keyroom again. Your Green Key is goneand you can not go through the door again."
               ,(allocator *)&local_dc);
    ActionResults::ActionResults(this_01,THREE_KEY_ROOM,&local_38);
    this_02 = &local_38;
  }
  else {
    iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar2 == NORTH) {
      this_01 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"You can\'t go north, you can only go south.\n",
                 (allocator *)&local_dc);
      ActionResults::ActionResults(this_01,CURRENT,&local_58);
      this_02 = &local_58;
    }
    else {
      iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar2 == SOUTH) {
        this_01 = (ActionResults *)operator_new(0x30);
        std::__cxx11::string::string
                  ((string *)&local_78,"You go back to green room.\n",(allocator *)&local_dc);
        ActionResults::ActionResults(this_01,G_ROOM2_BUCKET,&local_78);
        this_02 = &local_78;
      }
      else {
        iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
        if (iVar2 == EAST) {
          this_01 = (ActionResults *)operator_new(0x30);
          std::__cxx11::string::string
                    ((string *)&local_98,"You can\'t go west, you can only go south..\n",
                     (allocator *)&local_dc);
          ActionResults::ActionResults(this_01,CURRENT,&local_98);
          this_02 = &local_98;
        }
        else {
          iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
          this_01 = (ActionResults *)operator_new(0x30);
          if (iVar2 == WEST) {
            std::__cxx11::string::string
                      ((string *)&local_b8,"You can\'t go west, you can only go south..\n",
                       (allocator *)&local_dc);
            ActionResults::ActionResults(this_01,CURRENT,&local_b8);
            this_02 = &local_b8;
          }
          else {
            std::__cxx11::string::string
                      ((string *)&local_d8,"You can\'t go there.\n",(allocator *)&local_dc);
            ActionResults::ActionResults(this_01,CURRENT,&local_d8);
            this_02 = &local_d8;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)this_02);
  return this_01;
}

Assistant:

ActionResults * GreenRoomFourAction::Go() {

    if(itemList->getValue(KID)->getLocation() == HIDDEN) {
        return new ActionResults(THREE_KEY_ROOM, "You find yourself in the keyroom again. Your Green Key is gone"
                "and you can not go through the door again.");
    }
    if (commands->getMainItem() == NORTH) {
        return new ActionResults(CURRENT, "You can't go north, you can only go south.\n");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(G_ROOM2_BUCKET, "You go back to green room.\n");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south..\n");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south..\n");
    }
    return new ActionResults(CURRENT,"You can't go there.\n");

}